

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeotriangle.h
# Opt level: O0

void pzgeom::TPZGeoTriangle::X<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *x)

{
  double dVar1;
  int iVar2;
  int64_t iVar3;
  double *row;
  double *pdVar4;
  TPZVec<double> *in_RDX;
  TPZBaseMatrix *in_RDI;
  double extraout_XMM0_Qa;
  int j;
  int i;
  int space;
  TPZFNMatrix<6,_double> dphi;
  TPZFNMatrix<3,_double> phi;
  double *in_stack_fffffffffffffe40;
  int64_t in_stack_fffffffffffffe48;
  TPZFNMatrix<6,_double> *this;
  int local_1a8;
  int local_1a4;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  TPZFMatrix<double> *in_stack_fffffffffffffe68;
  TPZVec<double> *in_stack_fffffffffffffe70;
  
  this = (TPZFNMatrix<6,_double> *)0x3;
  TPZFNMatrix<3,_double>::TPZFNMatrix
            ((TPZFNMatrix<3,_double> *)0x3,in_stack_fffffffffffffe48,
             (int64_t)in_stack_fffffffffffffe40);
  TPZFNMatrix<6,_double>::TPZFNMatrix
            (this,in_stack_fffffffffffffe48,(int64_t)in_stack_fffffffffffffe40);
  pztopology::TPZTriangle::TShape<double>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (TPZFMatrix<double> *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  iVar3 = TPZBaseMatrix::Rows(in_RDI);
  iVar2 = (int)iVar3;
  for (local_1a4 = 0; local_1a4 < iVar2; local_1a4 = local_1a4 + 1) {
    row = TPZVec<double>::operator[](in_RDX,(long)local_1a4);
    *row = 0.0;
    for (local_1a8 = 0; local_1a8 < 3; local_1a8 = local_1a8 + 1) {
      in_stack_fffffffffffffe40 =
           TPZFMatrix<double>::operator()
                     (&this->super_TPZFMatrix<double>,(int64_t)row,
                      (int64_t)in_stack_fffffffffffffe40);
      dVar1 = *in_stack_fffffffffffffe40;
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_1a4,(long)local_1a8);
      pdVar4 = TPZVec<double>::operator[](in_RDX,(long)local_1a4);
      *pdVar4 = dVar1 * extraout_XMM0_Qa + *pdVar4;
    }
  }
  TPZFNMatrix<6,_double>::~TPZFNMatrix((TPZFNMatrix<6,_double> *)0x1614ddc);
  TPZFNMatrix<3,_double>::~TPZFNMatrix((TPZFNMatrix<3,_double> *)0x1614de9);
  return;
}

Assistant:

static void X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x) {

            TPZFNMatrix<3,T> phi(3,1);
            TPZFNMatrix<6,T> dphi(2,3);
            TShape(loc,phi,dphi);
            int space = nodes.Rows();

            for(int i = 0; i < space; i++) {
                x[i] = 0.0;
                for(int j = 0; j < 3; j++) {
                    x[i] += phi(j,0)*nodes.GetVal(i,j);
                }
            }
        }